

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O0

void __thiscall QTextStreamPrivate::consumeLastToken(QTextStreamPrivate *this)

{
  long in_RDI;
  QTextStreamPrivate *unaff_retaddr;
  
  if (*(long *)(in_RDI + 0x140) != 0) {
    consume(unaff_retaddr,in_RDI);
  }
  *(undefined8 *)(in_RDI + 0x140) = 0;
  return;
}

Assistant:

inline void QTextStreamPrivate::consumeLastToken()
{
    if (lastTokenSize)
        consume(lastTokenSize);
    lastTokenSize = 0;
}